

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_policy.cpp
# Opt level: O2

ValuedAction __thiscall
despot::DefaultPolicy::Value
          (DefaultPolicy *this,vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  pointer ppSVar1;
  DSPOMDP *pDVar2;
  int iVar3;
  undefined4 extraout_var;
  int i_1;
  int i;
  ulong uVar4;
  ValuedAction VVar5;
  ValuedAction VVar6;
  vector<despot::State_*,_std::allocator<despot::State_*>_> copy;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_58;
  State *local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar4 = 0;
  while( true ) {
    ppSVar1 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(particles->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3) <= uVar4) break;
    pDVar2 = (this->super_ScenarioLowerBound).model_;
    iVar3 = (*pDVar2->_vptr_DSPOMDP[0x16])(pDVar2,ppSVar1[uVar4]);
    local_38 = (State *)CONCAT44(extraout_var,iVar3);
    std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
              ((vector<despot::State*,std::allocator<despot::State*>> *)&local_58,&local_38);
    uVar4 = uVar4 + 1;
  }
  this->initial_depth_ =
       (int)((ulong)((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2);
  VVar5 = RecursiveValue(this,(vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_58
                         ,streams,history);
  VVar6.action = VVar5.action;
  uVar4 = 0;
  while( true ) {
    if ((ulong)((long)local_58._M_impl.super__Vector_impl_data._M_finish -
                (long)local_58._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar4) break;
    pDVar2 = (this->super_ScenarioLowerBound).model_;
    (*pDVar2->_vptr_DSPOMDP[0x17])(pDVar2,local_58._M_impl.super__Vector_impl_data._M_start[uVar4]);
    uVar4 = uVar4 + 1;
  }
  std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_58);
  VVar6._4_4_ = 0;
  VVar6.value = VVar5.value;
  return VVar6;
}

Assistant:

ValuedAction DefaultPolicy::Value(const vector<State*>& particles,
	RandomStreams& streams, History& history) const {
	vector<State*> copy;
	for (int i = 0; i < particles.size(); i++)
		copy.push_back(model_->Copy(particles[i]));

	initial_depth_ = history.Size();
	ValuedAction va = RecursiveValue(copy, streams, history);

	for (int i = 0; i < copy.size(); i++)
		model_->Free(copy[i]);

	return va;
}